

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sequence_info.cpp
# Opt level: O2

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateSequenceInfo::Copy(CreateSequenceInfo *this)

{
  bool bVar1;
  uint64_t uVar2;
  int64_t iVar3;
  pointer pcVar4;
  size_type sVar5;
  _Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false> in_RAX;
  type other;
  pointer pCVar6;
  pointer *__ptr;
  CreateInfo *in_RSI;
  _Tuple_impl<0UL,_duckdb::CreateSequenceInfo_*,_std::default_delete<duckdb::CreateSequenceInfo>_>
  local_28;
  
  local_28.super__Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>)
       (_Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>)in_RAX._M_head_impl;
  make_uniq<duckdb::CreateSequenceInfo>();
  other = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
          ::operator*((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                       *)&local_28);
  CreateInfo::CopyProperties(in_RSI,&other->super_CreateInfo);
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  ::std::__cxx11::string::_M_assign((string *)&pCVar6->name);
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar6->super_CreateInfo).schema);
  uVar2 = in_RSI[1].catalog.field_2._M_allocated_capacity;
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  pCVar6->usage_count = uVar2;
  iVar3 = *(int64_t *)((long)&in_RSI[1].catalog.field_2 + 8);
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  pCVar6->increment = iVar3;
  pcVar4 = in_RSI[1].schema._M_dataplus._M_p;
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  pCVar6->min_value = (int64_t)pcVar4;
  sVar5 = in_RSI[1].schema._M_string_length;
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  pCVar6->max_value = sVar5;
  sVar5 = in_RSI[1].schema.field_2._M_allocated_capacity;
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  pCVar6->start_value = sVar5;
  bVar1 = (bool)in_RSI[1].schema.field_2._M_local_buf[8];
  pCVar6 = unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSequenceInfo,_std::default_delete<duckdb::CreateSequenceInfo>,_true>
                         *)&local_28);
  pCVar6->cycle = bVar1;
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_28.super__Head_base<0UL,_duckdb::CreateSequenceInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateSequenceInfo::Copy() const {
	auto result = make_uniq<CreateSequenceInfo>();
	CopyProperties(*result);
	result->name = name;
	result->schema = schema;
	result->usage_count = usage_count;
	result->increment = increment;
	result->min_value = min_value;
	result->max_value = max_value;
	result->start_value = start_value;
	result->cycle = cycle;
	return std::move(result);
}